

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::anon_unknown_15::translateActiveException(void)

{
  pointer ppIVar1;
  int iVar2;
  undefined8 uVar3;
  String *in_RDI;
  pointer ppIVar4;
  String res;
  anon_union_24_2_13149d16_for_String_3 local_38;
  
  local_38.buf[0] = '\0';
  local_38.buf[0x17] = '\x17';
  getExceptionTranslators();
  ppIVar1 = getExceptionTranslators::data.
            super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar4 = getExceptionTranslators::data.
            super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppIVar4 == ppIVar1) {
      uVar3 = __cxa_rethrow();
      String::~String((String *)&local_38.data);
      _Unwind_Resume(uVar3);
    }
    iVar2 = (*(*ppIVar4)->_vptr_IExceptionTranslator[2])(*ppIVar4,&local_38);
    ppIVar4 = ppIVar4 + 1;
  } while ((char)iVar2 == '\0');
  *(ulong *)((long)&in_RDI->field_0 + 0x10) = CONCAT17(local_38.buf[0x17],local_38._16_7_);
  (in_RDI->field_0).data.ptr = (char *)CONCAT71(local_38._1_7_,local_38.buf[0]);
  *(undefined8 *)((long)&in_RDI->field_0 + 8) = local_38._8_8_;
  local_38.buf[0] = '\0';
  local_38.buf[0x17] = '\x17';
  String::~String((String *)&local_38.data);
  return in_RDI;
}

Assistant:

String translateActiveException() {
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        String res;
        auto&  translators = getExceptionTranslators();
        for(auto& curr : translators)
            if(curr->translate(res))
                return res;
        // clang-format off
        DOCTEST_GCC_SUPPRESS_WARNING_WITH_PUSH("-Wcatch-value")
        try {
            throw;
        } catch(std::exception& ex) {
            return ex.what();
        } catch(std::string& msg) {
            return msg.c_str();
        } catch(const char* msg) {
            return msg;
        } catch(...) {
            return "unknown exception";
        }
        DOCTEST_GCC_SUPPRESS_WARNING_POP
// clang-format on
#else  // DOCTEST_CONFIG_NO_EXCEPTIONS
        return "";
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
    }